

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::SubImageErrorsTest::Prepare(SubImageErrorsTest *this)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  GLubyte *pGVar7;
  uint local_28;
  uint local_24;
  GLuint i_1;
  GLuint i;
  bool is_valid;
  long lStack_18;
  GLint is_compressed;
  Functions *gl;
  SubImageErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lStack_18 + 0x400))(0xde0,1,&this->m_to_1D_empty);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x23e9);
  (**(code **)(lStack_18 + 0x400))(0xde1,1,&this->m_to_2D_empty);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x23ed);
  (**(code **)(lStack_18 + 0x400))(0x806f,1,&this->m_to_3D_empty);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x23f1);
  (**(code **)(lStack_18 + 0x400))(0xde0,1,&this->m_to_1D);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x23f5);
  (**(code **)(lStack_18 + 0xb8))(0xde0,this->m_to_1D);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x23f8);
  (**(code **)(lStack_18 + 0x1308))(0xde0,0,0x822b,4,0,0x8227,0x1401,s_reference);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glTexImage1D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x23fc);
  (**(code **)(lStack_18 + 0x400))(0xde1,1,&this->m_to_2D);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2400);
  (**(code **)(lStack_18 + 0xb8))(0xde1,this->m_to_2D);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2403);
  (**(code **)(lStack_18 + 0x1310))(0xde1,0,0x822b,4,4,0,0x8227,0x1401,s_reference);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glTexImage1D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2407);
  (**(code **)(lStack_18 + 0x400))(0x806f,1,&this->m_to_3D);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x240b);
  (**(code **)(lStack_18 + 0xb8))(0x806f,this->m_to_3D);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x240e);
  (**(code **)(lStack_18 + 0x1320))(0x806f,0,0x822b,4,4,4,0,0x8227,0x1401,s_reference);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glTexImage1D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2412);
  (**(code **)(lStack_18 + 0x400))(0xde0,1,&this->m_to_1D_compressed);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2416);
  (**(code **)(lStack_18 + 0xb8))(0xde0,this->m_to_1D_compressed);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2419);
  (**(code **)(lStack_18 + 0x1308))(0xde0,0,0x8226,4,0,0x8227,0x1401,s_reference);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glTexImage1D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x241d);
  i = 0;
  (**(code **)(lStack_18 + 0xab0))(0xde0,0,0x86a1,&i);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glTetTexLevelParameteriv has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2422);
  if (i != 0) {
    (**(code **)(lStack_18 + 0xab0))(0xde0,0,0x1003,&this->m_reference_compressed_1D_format);
    dVar5 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar5,"glGetTexLevelParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2427);
    this->m_reference_compressed_1D_size = 0;
    (**(code **)(lStack_18 + 0xab0))(0xde0,0,0x86a0,&this->m_reference_compressed_1D_size);
    dVar5 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar5,"glGetTexLevelParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x242c);
    if (this->m_reference_compressed_1D_size != 0) {
      pGVar7 = (GLubyte *)operator_new__((long)this->m_reference_compressed_1D_size);
      this->m_reference_compressed_1D = pGVar7;
      (**(code **)(lStack_18 + 0x7c8))(0xde0,0,this->m_reference_compressed_1D);
      dVar5 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar5,"glGetCompressedTexImage has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2433);
    }
  }
  (**(code **)(lStack_18 + 0x400))(0xde1,1,&this->m_to_2D_compressed);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2439);
  (**(code **)(lStack_18 + 0xb8))(0xde1,this->m_to_2D_compressed);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x243c);
  (**(code **)(lStack_18 + 0x1310))(0xde1,0,0x8226,4,4,0,0x8227,0x1401,s_reference);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glTexImage2D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2440);
  i = 0;
  (**(code **)(lStack_18 + 0xab0))(0xde1,0,0x86a1,&i);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glTetTexLevelParameteriv has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2445);
  if (i != 0) {
    (**(code **)(lStack_18 + 0xab0))(0xde1,0,0x1003,&this->m_reference_compressed_2D_format);
    dVar5 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar5,"glGetTexLevelParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x244a);
    this->m_reference_compressed_2D_size = 0;
    (**(code **)(lStack_18 + 0xab0))(0xde1,0,0x86a0,&this->m_reference_compressed_2D_size);
    dVar5 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar5,"glGetTexLevelParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x244f);
    if (this->m_reference_compressed_2D_size != 0) {
      pGVar7 = (GLubyte *)operator_new__((long)this->m_reference_compressed_2D_size);
      this->m_reference_compressed_2D = pGVar7;
      (**(code **)(lStack_18 + 0x7c8))(0xde1,0,this->m_reference_compressed_2D);
      dVar5 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar5,"glGetCompressedTexImage has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2456);
    }
  }
  (**(code **)(lStack_18 + 0x400))(0x8c1a,1,&this->m_to_3D_compressed);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x245c);
  (**(code **)(lStack_18 + 0xb8))(0x8c1a,this->m_to_3D_compressed);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x245f);
  (**(code **)(lStack_18 + 0x1320))(0x8c1a,0,0x8226,4,4,4,0,0x8227,0x1401,s_reference);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glTexImage3D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2463);
  i = 0;
  (**(code **)(lStack_18 + 0xab0))(0x8c1a,0,0x86a1,&i);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glTetTexLevelParameteriv has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2468);
  if (i != 0) {
    (**(code **)(lStack_18 + 0xab0))(0x8c1a,0,0x1003,&this->m_reference_compressed_3D_format);
    dVar5 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar5,"glGetTexLevelParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x246e);
    this->m_reference_compressed_3D_size = 0;
    (**(code **)(lStack_18 + 0xab0))(0x8c1a,0,0x86a0,&this->m_reference_compressed_3D_size);
    dVar5 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar5,"glGetTexLevelParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2474);
    if (this->m_reference_compressed_3D_size != 0) {
      pGVar7 = (GLubyte *)operator_new__((long)this->m_reference_compressed_3D_size);
      this->m_reference_compressed_3D = pGVar7;
      (**(code **)(lStack_18 + 0x7c8))(0x8c1a,0,this->m_reference_compressed_3D);
      dVar5 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar5,"glGetCompressedTexImage has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x247b);
    }
  }
  (**(code **)(lStack_18 + 0x400))(0x84f5,1,&this->m_to_rectangle_compressed);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2481);
  (**(code **)(lStack_18 + 0xb8))(0x84f5,this->m_to_rectangle_compressed);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2484);
  (**(code **)(lStack_18 + 0x1310))(0x84f5,0,0x8226,4,4,0,0x8227,0x1401,s_reference);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glTexImage2D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2488);
  i = 0;
  (**(code **)(lStack_18 + 0xab0))(0x84f5,0,0x86a1,&i);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glTetTexLevelParameteriv has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x248d);
  if (i != 0) {
    (**(code **)(lStack_18 + 0xab0))(0x84f5,0,0x1003,&this->m_reference_compressed_rectangle_format)
    ;
    dVar5 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar5,"glGetTexLevelParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2493);
    this->m_reference_compressed_rectangle_size = 0;
    (**(code **)(lStack_18 + 0xab0))(0x84f5,0,0x86a0,&this->m_reference_compressed_rectangle_size);
    dVar5 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar5,"glGetTexLevelParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2499);
    if (this->m_reference_compressed_rectangle_size != 0) {
      pGVar7 = (GLubyte *)operator_new__((long)this->m_reference_compressed_rectangle_size);
      this->m_reference_compressed_rectangle = pGVar7;
      (**(code **)(lStack_18 + 0x7c8))(0x84f5,0,this->m_reference_compressed_rectangle);
      dVar5 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar5,"glGetCompressedTexImage has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x24a0);
    }
  }
  (**(code **)(lStack_18 + 0x3b8))(1,&this->m_bo);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glCreateBuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x24a6);
  (**(code **)(lStack_18 + 0xec0))(this->m_bo,0x200,s_reference,0x88e6);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glNamedBufferData has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x24a9);
  do {
    pcVar1 = *(code **)(lStack_18 + 0xcc8);
    this->m_to_invalid = this->m_to_invalid + 1;
    cVar3 = (*pcVar1)();
  } while (cVar3 != '\0');
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glIsTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x24b0);
  bVar2 = true;
  this->m_format_invalid = 0;
  do {
    if (!bVar2) {
      bVar2 = true;
      this->m_type_invalid = 0;
      do {
        if (!bVar2) {
          (**(code **)(lStack_18 + 0x868))(0xd33,&this->m_max_texture_size);
          dVar5 = (**(code **)(lStack_18 + 0x800))();
          glu::checkError(dVar5,"glGetIntegerv has failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                          ,0x2509);
          this->m_format_compressed_not_matching = 0x8dbb;
          return;
        }
        bVar2 = false;
        this->m_type_invalid = this->m_type_invalid + 1;
        for (local_28 = 0; local_28 < 0x18; local_28 = local_28 + 1) {
          if (Prepare::all_types[local_28] == this->m_type_invalid) {
            bVar2 = true;
            break;
          }
        }
      } while( true );
    }
    bVar2 = false;
    this->m_format_invalid = this->m_format_invalid + 1;
    for (local_24 = 0; local_24 < 0x13; local_24 = local_24 + 1) {
      if (Prepare::all_formats[local_24] == this->m_format_invalid) {
        bVar2 = true;
        break;
      }
    }
  } while( true );
}

Assistant:

void SubImageErrorsTest::Prepare()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Auxiliary objects setup. */

	/* 1D */
	gl.createTextures(GL_TEXTURE_1D, 1, &m_to_1D_empty);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	/* 2D */
	gl.createTextures(GL_TEXTURE_2D, 1, &m_to_2D_empty);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	/* 3D */
	gl.createTextures(GL_TEXTURE_3D, 1, &m_to_3D_empty);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	/* 1D */
	gl.createTextures(GL_TEXTURE_1D, 1, &m_to_1D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	gl.bindTexture(GL_TEXTURE_1D, m_to_1D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.texImage1D(GL_TEXTURE_1D, 0, s_reference_internalformat, s_reference_width, 0, s_reference_format,
				  GL_UNSIGNED_BYTE, s_reference);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D has failed");

	/* 2D */
	gl.createTextures(GL_TEXTURE_2D, 1, &m_to_2D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	gl.bindTexture(GL_TEXTURE_2D, m_to_2D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.texImage2D(GL_TEXTURE_2D, 0, s_reference_internalformat, s_reference_width, s_reference_height, 0,
				  s_reference_format, GL_UNSIGNED_BYTE, s_reference);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D has failed");

	/* 3D */
	gl.createTextures(GL_TEXTURE_3D, 1, &m_to_3D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	gl.bindTexture(GL_TEXTURE_3D, m_to_3D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.texImage3D(GL_TEXTURE_3D, 0, s_reference_internalformat, s_reference_width, s_reference_height,
				  s_reference_depth, 0, s_reference_format, GL_UNSIGNED_BYTE, s_reference);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D has failed");

	/* 1D Compressed */
	gl.createTextures(GL_TEXTURE_1D, 1, &m_to_1D_compressed);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	gl.bindTexture(GL_TEXTURE_1D, m_to_1D_compressed);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.texImage1D(GL_TEXTURE_1D, 0, s_reference_internalformat_compressed, s_reference_width, 0, s_reference_format,
				  GL_UNSIGNED_BYTE, s_reference);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D has failed");

	glw::GLint is_compressed = 0;

	gl.getTexLevelParameteriv(GL_TEXTURE_1D, 0, GL_TEXTURE_COMPRESSED, &is_compressed);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTetTexLevelParameteriv has failed");

	if (is_compressed)
	{
		gl.getTexLevelParameteriv(GL_TEXTURE_1D, 0, GL_TEXTURE_INTERNAL_FORMAT, &m_reference_compressed_1D_format);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv has failed");

		m_reference_compressed_1D_size = 0;

		gl.getTexLevelParameteriv(GL_TEXTURE_1D, 0, GL_TEXTURE_COMPRESSED_IMAGE_SIZE, &m_reference_compressed_1D_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv has failed");

		if (m_reference_compressed_1D_size)
		{
			m_reference_compressed_1D = new glw::GLubyte[m_reference_compressed_1D_size];

			gl.getCompressedTexImage(GL_TEXTURE_1D, 0, m_reference_compressed_1D);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetCompressedTexImage has failed");
		}
	}

	/* 2D Compressed */
	gl.createTextures(GL_TEXTURE_2D, 1, &m_to_2D_compressed);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	gl.bindTexture(GL_TEXTURE_2D, m_to_2D_compressed);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.texImage2D(GL_TEXTURE_2D, 0, s_reference_internalformat_compressed, s_reference_width, s_reference_height, 0,
				  s_reference_format, GL_UNSIGNED_BYTE, s_reference);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

	is_compressed = 0;

	gl.getTexLevelParameteriv(GL_TEXTURE_2D, 0, GL_TEXTURE_COMPRESSED, &is_compressed);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTetTexLevelParameteriv has failed");

	if (is_compressed)
	{
		gl.getTexLevelParameteriv(GL_TEXTURE_2D, 0, GL_TEXTURE_INTERNAL_FORMAT, &m_reference_compressed_2D_format);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv has failed");

		m_reference_compressed_2D_size = 0;

		gl.getTexLevelParameteriv(GL_TEXTURE_2D, 0, GL_TEXTURE_COMPRESSED_IMAGE_SIZE, &m_reference_compressed_2D_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv has failed");

		if (m_reference_compressed_2D_size)
		{
			m_reference_compressed_2D = new glw::GLubyte[m_reference_compressed_2D_size];

			gl.getCompressedTexImage(GL_TEXTURE_2D, 0, m_reference_compressed_2D);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetCompressedTexImage has failed");
		}
	}

	/* 3D Compressed */
	gl.createTextures(GL_TEXTURE_2D_ARRAY, 1, &m_to_3D_compressed);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_to_3D_compressed);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.texImage3D(GL_TEXTURE_2D_ARRAY, 0, s_reference_internalformat_compressed, s_reference_width, s_reference_height,
				  s_reference_depth, 0, s_reference_format, GL_UNSIGNED_BYTE, s_reference);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage3D has failed");

	is_compressed = 0;

	gl.getTexLevelParameteriv(GL_TEXTURE_2D_ARRAY, 0, GL_TEXTURE_COMPRESSED, &is_compressed);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTetTexLevelParameteriv has failed");

	if (is_compressed)
	{
		gl.getTexLevelParameteriv(GL_TEXTURE_2D_ARRAY, 0, GL_TEXTURE_INTERNAL_FORMAT,
								  &m_reference_compressed_3D_format);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv has failed");

		m_reference_compressed_3D_size = 0;

		gl.getTexLevelParameteriv(GL_TEXTURE_2D_ARRAY, 0, GL_TEXTURE_COMPRESSED_IMAGE_SIZE,
								  &m_reference_compressed_3D_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv has failed");

		if (m_reference_compressed_3D_size)
		{
			m_reference_compressed_3D = new glw::GLubyte[m_reference_compressed_3D_size];

			gl.getCompressedTexImage(GL_TEXTURE_2D_ARRAY, 0, m_reference_compressed_3D);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetCompressedTexImage has failed");
		}
	}

	/* RECTANGLE Compressed */
	gl.createTextures(GL_TEXTURE_RECTANGLE, 1, &m_to_rectangle_compressed);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	gl.bindTexture(GL_TEXTURE_RECTANGLE, m_to_rectangle_compressed);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.texImage2D(GL_TEXTURE_RECTANGLE, 0, s_reference_internalformat_compressed, s_reference_width, s_reference_height,
				  0, s_reference_format, GL_UNSIGNED_BYTE, s_reference);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

	is_compressed = 0;

	gl.getTexLevelParameteriv(GL_TEXTURE_RECTANGLE, 0, GL_TEXTURE_COMPRESSED, &is_compressed);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTetTexLevelParameteriv has failed");

	if (is_compressed)
	{
		gl.getTexLevelParameteriv(GL_TEXTURE_RECTANGLE, 0, GL_TEXTURE_INTERNAL_FORMAT,
								  &m_reference_compressed_rectangle_format);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv has failed");

		m_reference_compressed_rectangle_size = 0;

		gl.getTexLevelParameteriv(GL_TEXTURE_RECTANGLE, 0, GL_TEXTURE_COMPRESSED_IMAGE_SIZE,
								  &m_reference_compressed_rectangle_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv has failed");

		if (m_reference_compressed_rectangle_size)
		{
			m_reference_compressed_rectangle = new glw::GLubyte[m_reference_compressed_rectangle_size];

			gl.getCompressedTexImage(GL_TEXTURE_RECTANGLE, 0, m_reference_compressed_rectangle);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetCompressedTexImage has failed");
		}
	}

	/* Buffer object */
	gl.createBuffers(1, &m_bo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers has failed");

	gl.namedBufferData(m_bo, s_reference_size, s_reference, GL_STATIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData has failed");

	/* Invalid values */

	/* invalid texture object */
	while (gl.isTexture(++m_to_invalid))
		;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glIsTexture has failed");

	/* invalid internal format */
	static const glw::GLenum all_formats[] = { GL_STENCIL_INDEX,
											   GL_DEPTH_COMPONENT,
											   GL_DEPTH_STENCIL,
											   GL_RED,
											   GL_GREEN,
											   GL_BLUE,
											   GL_RG,
											   GL_RGB,
											   GL_RGBA,
											   GL_BGR,
											   GL_BGRA,
											   GL_RED_INTEGER,
											   GL_GREEN_INTEGER,
											   GL_BLUE_INTEGER,
											   GL_RG_INTEGER,
											   GL_RGB_INTEGER,
											   GL_RGBA_INTEGER,
											   GL_BGR_INTEGER,
											   GL_BGRA_INTEGER };

	static const glw::GLuint all_internal_formats_count = sizeof(all_formats) / sizeof(all_formats[0]);

	bool is_valid	= true;
	m_format_invalid = 0;

	while (is_valid)
	{
		is_valid = false;
		m_format_invalid++;
		for (glw::GLuint i = 0; i < all_internal_formats_count; ++i)
		{
			if (all_formats[i] == m_format_invalid)
			{
				is_valid = true;
				break;
			}
		}
	}

	/* Invalid type. */
	static const glw::GLenum all_types[] = { GL_UNSIGNED_BYTE,
											 GL_BYTE,
											 GL_UNSIGNED_SHORT,
											 GL_SHORT,
											 GL_UNSIGNED_INT,
											 GL_INT,
											 GL_HALF_FLOAT,
											 GL_FLOAT,
											 GL_UNSIGNED_BYTE_3_3_2,
											 GL_UNSIGNED_BYTE_2_3_3_REV,
											 GL_UNSIGNED_SHORT_5_6_5,
											 GL_UNSIGNED_SHORT_5_6_5_REV,
											 GL_UNSIGNED_SHORT_4_4_4_4,
											 GL_UNSIGNED_SHORT_4_4_4_4_REV,
											 GL_UNSIGNED_SHORT_5_5_5_1,
											 GL_UNSIGNED_SHORT_1_5_5_5_REV,
											 GL_UNSIGNED_INT_8_8_8_8,
											 GL_UNSIGNED_INT_8_8_8_8_REV,
											 GL_UNSIGNED_INT_10_10_10_2,
											 GL_UNSIGNED_INT_2_10_10_10_REV,
											 GL_UNSIGNED_INT_24_8,
											 GL_UNSIGNED_INT_10F_11F_11F_REV,
											 GL_UNSIGNED_INT_5_9_9_9_REV,
											 GL_FLOAT_32_UNSIGNED_INT_24_8_REV };

	static const glw::GLuint all_types_count = sizeof(all_types) / sizeof(all_types[0]);

	is_valid	   = true;
	m_type_invalid = 0;

	while (is_valid)
	{
		is_valid = false;
		m_type_invalid++;
		for (glw::GLuint i = 0; i < all_types_count; ++i)
		{
			if (all_types[i] == m_type_invalid)
			{
				is_valid = true;
				break;
			}
		}
	}

	/* Maximum texture size.*/
	gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &m_max_texture_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

	m_format_compressed_not_matching =
		GL_COMPRESSED_RED_RGTC1; /* The exact compressed format is not know (implementation chooses it), but it will be one og GL_COMPRESSED_*RG*  - so this one will always be non matching. */
}